

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
OperatorBracket<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
::TestBody(OperatorBracket<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  AssertHelper *pAVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  pointer ppVar5;
  pointer k;
  char *pcVar6;
  AssertionResult gtest_ar;
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  values;
  TypeParam m;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_530;
  internal local_528 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  undefined1 local_518 [24];
  anon_union_8_1_a8a14541_for_iterator_1 local_500 [2];
  AssertHelper aAStack_4f0 [3];
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_4d8;
  long lStack_4c0;
  pointer local_4b8;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_4b0;
  
  local_4d8.
  super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<int_const,phmap::priv::NonStandardLayout>,std::allocator<std::pair<int_const,phmap::priv::NonStandardLayout>>>>,int,phmap::priv::hash_internal::Generator<std::pair<int_const,phmap::priv::NonStandardLayout>,void>>
            ();
  lVar4 = 0x40;
  do {
    *(undefined8 *)((long)&aAStack_4f0[2].data_ + lVar4) = 0;
    *(undefined8 *)
     ((long)&local_4d8.
             super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4) = 0;
    *(undefined8 *)((long)&aAStack_4f0[0].data_ + lVar4) = 0;
    *(undefined8 *)((long)&aAStack_4f0[1].data_ + lVar4) = 0;
    *(undefined8 *)
     ((long)&local_4d8.
             super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4) = 0;
    *(long *)((long)&lStack_4c0 + lVar4) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_4b0.sets_._M_elems + lVar4 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4b0.sets_._M_elems[0].set_.ctrl_ + lVar4) = 0;
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x4c0);
  local_4b8 = local_4d8.
              super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4d8.
      super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4d8.
      super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar5 = local_4d8.
             super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)ppVar5->first;
      parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
      ::try_emplace_impl_with_hash<int_const&>
                ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
                  *)local_518,
                 (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
                  *)&local_4b0,
                 SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),&ppVar5->first);
      lVar4 = CONCAT71(local_500[0]._1_7_,local_500[0]._0_1_);
      local_518._0_8_ = &PTR__NonStandardLayout_0034a128;
      local_518._16_8_ = (ctrl_t *)0x0;
      local_500[0]._0_1_ = 0;
      local_518._8_8_ = local_500;
      testing::internal::CmpHelperEQ<phmap::priv::NonStandardLayout,phmap::priv::NonStandardLayout>
                (local_528,"V()","val",(NonStandardLayout *)local_518,
                 (NonStandardLayout *)(lVar4 + 8));
      local_518._0_8_ = &PTR__NonStandardLayout_0034a128;
      if ((anon_union_8_1_a8a14541_for_iterator_1 *)local_518._8_8_ != local_500) {
        operator_delete((void *)local_518._8_8_,CONCAT71(local_500[0]._1_7_,local_500[0]._0_1_) + 1)
        ;
      }
      if (local_528[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_530);
        testing::PrintToString<int>((string *)local_518,&ppVar5->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_530._M_head_impl + 0x10),(char *)local_518._0_8_,
                   local_518._8_8_);
        pcVar6 = "";
        pAVar1 = aAStack_4f0 + 2;
        if (local_520 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = (local_520->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (pAVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x3c,pcVar6);
        testing::internal::AssertHelper::operator=(pAVar1,(Message *)&local_530);
        testing::internal::AssertHelper::~AssertHelper(pAVar1);
        if ((Inner *)local_518._0_8_ != (Inner *)(local_518 + 0x10)) {
          operator_delete((void *)local_518._0_8_,(ulong)(local_518._16_8_ + 1));
        }
        if (local_530._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_530._M_head_impl + 8))();
        }
      }
      if (local_520 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_520,local_520);
      }
      std::__cxx11::string::_M_assign((string *)(lVar4 + 0x10));
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != local_4b8);
  }
  ppVar5 = local_4d8.
           super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4d8.
      super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4d8.
      super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pAVar1 = aAStack_4f0 + 2;
    k = local_4d8.
        super__Vector_base<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)k->first;
      parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
      ::try_emplace_impl_with_hash<int_const&>
                ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
                  *)local_518,
                 (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
                  *)&local_4b0,
                 SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0),&k->first);
      testing::internal::CmpHelperEQ<phmap::priv::NonStandardLayout,phmap::priv::NonStandardLayout>
                (local_528,"p.second","m[p.first]",&k->second,
                 (NonStandardLayout *)(CONCAT71(local_500[0]._1_7_,local_500[0]._0_1_) + 8));
      if (local_528[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_530);
        testing::PrintToString<int>((string *)local_518,&k->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_530._M_head_impl + 0x10),(char *)local_518._0_8_,
                   local_518._8_8_);
        pcVar6 = "";
        if (local_520 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = (local_520->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (pAVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x40,pcVar6);
        testing::internal::AssertHelper::operator=(pAVar1,(Message *)&local_530);
        testing::internal::AssertHelper::~AssertHelper(pAVar1);
        if ((Inner *)local_518._0_8_ != (Inner *)(local_518 + 0x10)) {
          operator_delete((void *)local_518._0_8_,(ulong)(local_518._16_8_ + 1));
        }
        if (local_530._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_530._M_head_impl + 8))();
        }
      }
      if (local_520 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_520,local_520);
      }
      k = k + 1;
    } while (k != ppVar5);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~parallel_hash_set(&local_4b0);
  std::
  vector<std::pair<const_int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~vector(&local_4d8);
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}